

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O2

void __thiscall
MockMemoryReportFormatter::report_free_memory
          (MockMemoryReportFormatter *this,TestResult *result,TestMemoryAllocator *allocator,
          char *param_3,char *param_4,size_t param_5)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  TemporaryDefaultNewAllocator tempAlloc;
  TemporaryDefaultNewAllocator local_70;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  
  TemporaryDefaultNewAllocator::TemporaryDefaultNewAllocator(&local_70,previousNewAllocator);
  SimpleString::SimpleString(&local_28,"formatter");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"report_free_memory");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_38);
  SimpleString::SimpleString(&local_48,"result");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x80))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_48,result);
  SimpleString::SimpleString(&local_58,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_68,"allocator");
  (**(code **)(*plVar3 + 0x20))(plVar3,&local_58,&local_68,allocator);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  TemporaryDefaultNewAllocator::~TemporaryDefaultNewAllocator(&local_70);
  return;
}

Assistant:

virtual void report_free_memory(TestResult* result, TestMemoryAllocator* allocator, char* , const char* , size_t ) _override
    {
        TemporaryDefaultNewAllocator tempAlloc(previousNewAllocator);
        mock("formatter").actualCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", allocator);
    }